

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

void __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Set
          (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this,
          ArenaAllocator *allocator,Char kc,unsigned_long v)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  Inner *this_00;
  TrackAllocData local_58;
  uint local_2c;
  unsigned_long uStack_28;
  uint k;
  unsigned_long v_local;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAStack_18;
  Char kc_local;
  ArenaAllocator *allocator_local;
  CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this_local;
  
  uStack_28 = v;
  v_local._6_2_ = kc;
  pAStack_18 = &allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  allocator_local = (ArenaAllocator *)this;
  local_2c = Chars<char16_t>::CTU(kc);
  pAVar1 = pAStack_18;
  if (local_2c < 0x100) {
    BVStatic<256UL>::Set(&this->isInMap,local_2c);
    this->directMap[local_2c] = uStack_28;
  }
  else {
    if (this->root == (Type)0x0) {
      if (uStack_28 == this->defv) {
        return;
      }
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,
                 (type_info *)
                 &CharMap<char16_t,unsigned_long,(UnifiedRegex::CharMapScheme)1>::Inner::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                 ,0x10f);
      pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar1,&local_58);
      this_00 = (Inner *)new<Memory::ArenaAllocator>(0x88,(ArenaAllocator *)pAVar1,0x3f67b0);
      Inner::Inner(this_00);
      this->root = (Type)this_00;
    }
    (*this->root->_vptr_Node[1])(this->root,pAStack_18,this->defv,3,(ulong)local_2c,uStack_28);
  }
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, Char kc, V v)
        {
            uint k = CTU(kc);
            if (k < directSize)
            {
                isInMap.Set(k);
                directMap[k] = v;
            }
            else
            {
                if (root == 0)
                {
                    if (v == defv)
                        return;
                    root = Anew(allocator, Inner);
                }
                root->Set(allocator, defv, levels - 1, k, v);
            }
        }